

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O3

FormulaList * __thiscall FOOLElimination::process(FOOLElimination *this,FormulaList *formulas)

{
  Formula *pFVar1;
  List<Kernel::Formula_*> *pLVar2;
  List<Kernel::Formula_*> **ppLVar3;
  FormulaList *res;
  List<Kernel::Formula_*> *local_30;
  
  local_30 = (FormulaList *)0x0;
  if (formulas == (FormulaList *)0x0) {
    local_30 = (FormulaList *)0x0;
  }
  else {
    ppLVar3 = &local_30;
    do {
      pFVar1 = process(this,formulas->_head);
      pLVar2 = (List<Kernel::Formula_*> *)
               Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      pLVar2->_head = pFVar1;
      pLVar2->_tail = (List<Kernel::Formula_*> *)0x0;
      *ppLVar3 = pLVar2;
      ppLVar3 = &pLVar2->_tail;
      formulas = formulas->_tail;
    } while (formulas != (List<Kernel::Formula_*> *)0x0);
  }
  return local_30;
}

Assistant:

FormulaList* FOOLElimination::process(FormulaList* formulas) {
  FormulaList*  res = FormulaList::empty();
  FormulaList** ipt = &res;

  while (!FormulaList::isEmpty(formulas)) {
    Formula* processed = process(formulas->head());
    *ipt = new FormulaList(processed,FormulaList::empty());
    ipt = (*ipt)->tailPtr();
    formulas = formulas->tail();
  }

  return res;

  // return FormulaList::isEmpty(formulas) ? formulas : new FormulaList(process(formulas->head()), process(formulas->tail()));
}